

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

bool __thiscall
Pda::checkIfDouble(Pda *this,vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *v,Node *n)

{
  bool bVar1;
  reference ppNVar2;
  string *__lhs;
  string *__rhs;
  __type local_f6;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_e8;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_98;
  Node *local_48;
  Node *state;
  iterator __end1;
  iterator __begin1;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__range1;
  Node *n_local;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *v_local;
  Pda *this_local;
  
  __end1 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin(v);
  state = (Node *)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                                *)&state);
    if (!bVar1) {
      return false;
    }
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
              ::operator*(&__end1);
    local_48 = *ppNVar2;
    Tjen::Node::getStack(&local_98,local_48);
    Tjen::Node::getStack(&local_e8,n);
    bVar1 = std::operator==(&local_98,&local_e8);
    local_f6 = false;
    if (bVar1) {
      __lhs = Tjen::Node::getName_abi_cxx11_(local_48);
      __rhs = Tjen::Node::getName_abi_cxx11_(n);
      local_f6 = std::operator==(__lhs,__rhs);
    }
    std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_e8);
    std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_98);
    if (local_f6 != false) break;
    __gnu_cxx::
    __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool Pda::checkIfDouble(std::vector<Tjen::Node *> &v, Tjen::Node *n) {
    for(Tjen::Node* state : v){
        if(state->getStack() == n->getStack() && state->getName() == n->getName()){
            return true;
        }

    }
        return false;
}